

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O2

void duckdb::MapExtractValueFunc(DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  reference vector;
  reference target_v;
  Vector *source_v;
  Vector *source;
  list_entry_t *plVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t row_idx;
  idx_t idx;
  LogicalType local_140;
  UnifiedVectorFormat pos_format;
  UnifiedVectorFormat lst_format;
  Vector pos_vec;
  
  count = args->count;
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  target_v = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  if (((vector->type).id_ != SQLNULL) && ((target_v->type).id_ != SQLNULL)) {
    source_v = MapVector::GetKeys(vector);
    source = MapVector::GetValues(vector);
    LogicalType::LogicalType(&local_140,INTEGER);
    Vector::Vector(&pos_vec,&local_140,count);
    LogicalType::~LogicalType(&local_140);
    ListSearchOp<true>(vector,source_v,target_v,&pos_vec,args->count);
    UnifiedVectorFormat::UnifiedVectorFormat(&pos_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&lst_format);
    Vector::ToUnifiedFormat(&pos_vec,count,&pos_format);
    Vector::ToUnifiedFormat(vector,count,&lst_format);
    plVar1 = ListVector::GetData(vector);
    FlatVector::VerifyFlatVector(result);
    for (idx = 0; count != idx; idx = idx + 1) {
      iVar2 = idx;
      if ((lst_format.sel)->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)(lst_format.sel)->sel_vector[idx];
      }
      if ((lst_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((lst_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar2 >> 6]
           >> (iVar2 & 0x3f) & 1) != 0)) {
        iVar3 = idx;
        if ((pos_format.sel)->sel_vector != (sel_t *)0x0) {
          iVar3 = (idx_t)(pos_format.sel)->sel_vector[idx];
        }
        if ((pos_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((pos_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [iVar3 >> 6] >> (iVar3 & 0x3f) & 1) != 0)) {
          VectorOperations::Copy
                    (source,result,
                     (long)*(int *)(pos_format.data + iVar3 * 4) + plVar1[iVar2].offset,
                     ((long)*(int *)(pos_format.data + iVar3 * 4) + plVar1[iVar2].offset) - 1,idx);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,idx);
        }
      }
      else {
        FlatVector::SetNull(result,idx,true);
      }
    }
    if (args->count == 1) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    Vector::Verify(result,count);
    UnifiedVectorFormat::~UnifiedVectorFormat(&lst_format);
    UnifiedVectorFormat::~UnifiedVectorFormat(&pos_format);
    Vector::~Vector(&pos_vec);
    return;
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  ConstantVector::SetNull(result,true);
  Vector::Verify(result,count);
  return;
}

Assistant:

static void MapExtractValueFunc(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto count = args.size();

	auto &map_vec = args.data[0];
	auto &arg_vec = args.data[1];

	const auto map_is_null = map_vec.GetType().id() == LogicalTypeId::SQLNULL;
	const auto arg_is_null = arg_vec.GetType().id() == LogicalTypeId::SQLNULL;

	if (map_is_null || arg_is_null) {
		// Short-circuit if either the map or the arg is NULL
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		result.Verify(count);
		return;
	}

	auto &key_vec = MapVector::GetKeys(map_vec);
	auto &val_vec = MapVector::GetValues(map_vec);

	// Collect the matching positions
	Vector pos_vec(LogicalType::INTEGER, count);
	ListSearchOp<true>(map_vec, key_vec, arg_vec, pos_vec, args.size());

	UnifiedVectorFormat pos_format;
	UnifiedVectorFormat lst_format;

	pos_vec.ToUnifiedFormat(count, pos_format);
	map_vec.ToUnifiedFormat(count, lst_format);

	const auto pos_data = UnifiedVectorFormat::GetData<int32_t>(pos_format);
	const auto inc_list_data = ListVector::GetData(map_vec);

	auto &result_validity = FlatVector::Validity(result);
	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		auto lst_idx = lst_format.sel->get_index(row_idx);
		if (!lst_format.validity.RowIsValid(lst_idx)) {
			FlatVector::SetNull(result, row_idx, true);
			continue;
		}

		const auto pos_idx = pos_format.sel->get_index(row_idx);
		if (!pos_format.validity.RowIsValid(pos_idx)) {
			// We didnt find the key in the map, so return NULL
			result_validity.SetInvalid(row_idx);
			continue;
		}

		// Compute the actual position of the value in the map value vector
		const auto pos = inc_list_data[lst_idx].offset + UnsafeNumericCast<idx_t>(pos_data[pos_idx] - 1);
		VectorOperations::Copy(val_vec, result, pos + 1, pos, row_idx);
	}

	if (args.size() == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(count);
}